

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O0

void coll_tmap_balance_remove(coll_tmap_t *map,entry_t_conflict *entry)

{
  color_t cVar1;
  entry_t_conflict *peVar2;
  bool bVar3;
  entry_t_conflict *local_28;
  entry_t_conflict *sib_1;
  entry_t_conflict *sib;
  entry_t_conflict *entry_local;
  coll_tmap_t *map_local;
  
  sib = entry;
LAB_00108c90:
  do {
    bVar3 = false;
    if (sib != map->root) {
      cVar1 = color(sib);
      bVar3 = cVar1 == '\0';
    }
    if (!bVar3) {
      dye(sib,'\0');
      return;
    }
    peVar2 = parent(sib);
    peVar2 = left(peVar2);
    if (sib == peVar2) {
      peVar2 = parent(sib);
      sib_1 = right(peVar2);
      cVar1 = color(sib_1);
      if (cVar1 == '\x01') {
        dye(sib_1,'\0');
        peVar2 = parent(sib);
        dye(peVar2,'\x01');
        peVar2 = parent(sib);
        entry_rotate_left(map,peVar2);
        peVar2 = parent(sib);
        sib_1 = right(peVar2);
      }
      peVar2 = left(sib_1);
      cVar1 = color(peVar2);
      if (cVar1 == '\0') {
        peVar2 = right(sib_1);
        cVar1 = color(peVar2);
        if (cVar1 == '\0') {
          dye(sib_1,'\x01');
          sib = parent(sib);
          goto LAB_00108c90;
        }
      }
      peVar2 = right(sib_1);
      cVar1 = color(peVar2);
      if (cVar1 == '\0') {
        peVar2 = left(sib_1);
        dye(peVar2,'\0');
        dye(sib_1,'\x01');
        entry_rotate_right(map,sib_1);
        peVar2 = parent(sib);
        sib_1 = right(peVar2);
      }
      peVar2 = parent(sib);
      cVar1 = color(peVar2);
      dye(sib_1,cVar1);
      peVar2 = parent(sib);
      dye(peVar2,'\0');
      peVar2 = right(sib_1);
      dye(peVar2,'\0');
      peVar2 = parent(sib);
      entry_rotate_left(map,peVar2);
      sib = map->root;
      goto LAB_00108c90;
    }
    peVar2 = parent(sib);
    local_28 = left(peVar2);
    cVar1 = color(local_28);
    if (cVar1 == '\x01') {
      dye(local_28,'\0');
      peVar2 = parent(sib);
      dye(peVar2,'\x01');
      peVar2 = parent(sib);
      entry_rotate_right(map,peVar2);
      peVar2 = parent(sib);
      local_28 = left(peVar2);
    }
    peVar2 = right(local_28);
    cVar1 = color(peVar2);
    if (cVar1 == '\0') {
      peVar2 = left(local_28);
      cVar1 = color(peVar2);
      if (cVar1 == '\0') {
        dye(local_28,'\x01');
        sib = parent(sib);
        goto LAB_00108c90;
      }
    }
    peVar2 = left(local_28);
    cVar1 = color(peVar2);
    if (cVar1 == '\0') {
      peVar2 = right(local_28);
      dye(peVar2,'\0');
      dye(local_28,'\x01');
      entry_rotate_left(map,local_28);
      peVar2 = parent(sib);
      local_28 = left(peVar2);
    }
    peVar2 = parent(sib);
    cVar1 = color(peVar2);
    dye(local_28,cVar1);
    peVar2 = parent(sib);
    dye(peVar2,'\0');
    peVar2 = left(local_28);
    dye(peVar2,'\0');
    peVar2 = parent(sib);
    entry_rotate_right(map,peVar2);
    sib = map->root;
  } while( true );
}

Assistant:

static void coll_tmap_balance_remove(coll_tmap_t *map, entry_t *entry) {
    while (entry != map->root && color(entry) == BLACK) {
        if (entry == left(parent(entry))) {
            entry_t *sib = right(parent(entry));  // sibling

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_left(map, parent(entry));
                sib = right(parent(entry));
            }

            if (color(left(sib)) == BLACK && color(right(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(right(sib)) == BLACK) {
                    dye(left(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_right(map, sib);
                    sib = right(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(right(sib), BLACK);
                entry_rotate_left(map, parent(entry));
                entry = map->root;
            }
        } else {
            entry_t *sib = left(parent(entry));

            if (color(sib) == RED) {
                dye(sib, BLACK);
                dye(parent(entry), RED);
                entry_rotate_right(map, parent(entry));
                sib = left(parent(entry));
            }

            if (color(right(sib)) == BLACK && color(left(sib)) == BLACK) {
                dye(sib, RED);
                entry = parent(entry);
            } else {
                if (color(left(sib)) == BLACK) {
                    dye(right(sib), BLACK);
                    dye(sib, RED);
                    entry_rotate_left(map, sib);
                    sib = left(parent(entry));
                }
                dye(sib, color(parent(entry)));
                dye(parent(entry), BLACK);
                dye(left(sib), BLACK);
                entry_rotate_right(map, parent(entry));
                entry = map->root;
            }
        }
    }
    dye(entry, BLACK);
}